

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  int local_60;
  uint local_5c;
  UInt32 numHashBytes;
  uint fb;
  CLzmaEncProps props;
  CLzmaEnc *p;
  CLzmaEncProps *props2_local;
  CLzmaEncHandle pp_local;
  
  props._40_8_ = pp;
  memcpy(&numHashBytes,props2,0x30);
  LzmaEncProps_Normalize((CLzmaEncProps *)&numHashBytes);
  if ((((props.level < 9) && ((int)props.dictSize < 5)) && (props.lc < 5)) &&
     ((fb < 0x80000001 && (fb < 0x40000001)))) {
    *(uint *)(props._40_8_ + 0x3d350) = fb;
    *(int *)(props._40_8_ + 0x3d354) = props.btMode;
    local_5c = props.pb;
    if ((uint)props.pb < 5) {
      local_5c = 5;
    }
    if (0x111 < local_5c) {
      local_5c = 0x111;
    }
    *(uint *)(props._40_8_ + 0x32f68) = local_5c;
    *(int *)(props._40_8_ + 0x33bcc) = props.level;
    *(UInt32 *)(props._40_8_ + 0x33bd0) = props.dictSize;
    *(int *)(props._40_8_ + 0x33bd4) = props.lc;
    *(uint *)(props._40_8_ + 0x3d2e0) = (uint)(props.lp == 0);
    *(int *)(props._40_8_ + 0xa0) = props.algo;
    local_60 = 4;
    if (props.algo != 0) {
      if (props.fb < 2) {
        local_60 = 2;
      }
      else if (props.fb < 4) {
        local_60 = props.fb;
      }
    }
    *(int *)(props._40_8_ + 0x98) = local_60;
    *(int *)(props._40_8_ + 0x74) = props.btMode;
    *(int *)(props._40_8_ + 0x3d330) = props.numHashBytes;
    pp_local._4_4_ = 0;
  }
  else {
    pp_local._4_4_ = 5;
  }
  return pp_local._4_4_;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps* props2) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX ||
      props.lp > LZMA_LP_MAX ||
      props.pb > LZMA_PB_MAX ||
      props.dictSize > (1U << kDicLogSizeMaxCompress) ||
      props.dictSize > (1 << 30))
    return SZ_ERROR_PARAM;
  p->dictSize = props.dictSize;
  p->matchFinderCycles = props.mc;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = props.btMode;
  {
    UInt32 numHashBytes = 4;
    if (props.btMode) {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

#ifdef COMPRESS_MF_MT
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
#endif

  return SZ_OK;
}